

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O0

bool __thiscall MinVR::element::set_name(element *this,char *the_name)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  char *in_RSI;
  long in_RDI;
  int l;
  undefined1 local_1;
  
  if (in_RSI == (char *)0x0) {
    local_1 = false;
  }
  else {
    sVar2 = strlen(in_RSI);
    iVar1 = (int)sVar2;
    if (iVar1 == 0) {
      local_1 = false;
    }
    else {
      if ((*(byte *)(in_RDI + 0x79) & 1) != 0) {
        free(*(void **)(in_RDI + 0x80));
      }
      pvVar3 = malloc((long)iVar1 + 1);
      *(void **)(in_RDI + 0x80) = pvVar3;
      memset(*(void **)(in_RDI + 0x80),0,(long)iVar1 + 1);
      strcpy(*(char **)(in_RDI + 0x80),in_RSI);
      *(undefined1 *)(in_RDI + 0x79) = 1;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool element::set_name(const char* the_name)
{
    if(the_name != NULL)
    {
        int l;
        l=(int)strlen(the_name)*sizeof(char);
        if(l == 0)
            return false;
        if(name_is_allocated)
            free(m_name);
        m_name = (char*)malloc(l+sizeof(char));
        memset(m_name,'\0',l+sizeof(char));
        strcpy(m_name,the_name);
        name_is_allocated = true;
        return true;
    }
    return false;
}